

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

FILE * phosg::fdopen_binary_raw(int fd,string *mode)

{
  size_type sVar1;
  char *__modes;
  FILE *pFVar2;
  cannot_open_file *this;
  FILE *f;
  undefined1 local_38 [8];
  string new_mode;
  string *mode_local;
  int fd_local;
  
  new_mode.field_2._8_8_ = mode;
  ::std::__cxx11::string::string
            ((string *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mode);
  sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     'b',0);
  if (sVar1 == 0xffffffffffffffff) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,'b');
  }
  __modes = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
  pFVar2 = fdopen(fd,__modes);
  if (pFVar2 == (FILE *)0x0) {
    this = (cannot_open_file *)__cxa_allocate_exception(0x20);
    cannot_open_file::cannot_open_file(this,fd);
    __cxa_throw(this,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
  }
  ::std::__cxx11::string::~string((string *)local_38);
  return (FILE *)pFVar2;
}

Assistant:

static FILE* fdopen_binary_raw(int fd, const string& mode) {
  string new_mode = mode;
  if (new_mode.find('b') == string::npos) {
    new_mode += 'b';
  }
  FILE* f = fdopen(fd, new_mode.c_str());
  if (!f) {
    throw cannot_open_file(fd);
  }
  return f;
}